

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O3

void implementations::brainfck::BFTest(void)

{
  uint uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  BFEnvironment *pBVar2;
  BFImplementation *this_00;
  ostream *poVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  string hello_world;
  ThreadId thread_id;
  env_p env;
  BFMicrothreadManager manager;
  long *local_280;
  long local_278;
  long local_270 [2];
  uint local_25c;
  BFEnvironment *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  long *local_248;
  long local_240;
  long local_238 [2];
  long *local_228;
  long local_220;
  long local_218 [2];
  env_p local_208;
  env_p local_1f8;
  undefined8 local_1e8;
  undefined1 local_1e0 [8];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>,_std::_Select1st<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>
  local_1d8;
  _threads_iterator local_1a8;
  _Rb_tree<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation,_stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation,_std::_Identity<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>,_std::less<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>_>
  local_1a0;
  uint local_170;
  undefined8 local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  Microthread<implementations::brainfck::BFImplementation> local_148;
  long *local_c0;
  undefined **local_b8;
  long local_b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Deque_base<char,_std::allocator<char>_> local_90;
  
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,
             "\t+++++ +++          Set Cell #0 to 8                                      \t[                                                                         \t   >++++           Add 4 to Cell #1; this will always set Cell #1 to 4    \t   [               as the cell will be cleared by the loop                \t       >++         Add 4*2 to Cell #2                                     \t       >+++        Add 4*3 to Cell #3                                     \t       >+++        Add 4*3 to Cell #4                                     \t       >+          Add 4 to Cell #5                                       \t       <<<<-       Decrement the loop counter in Cell #1                  \t   ]               Loop till Cell #1 is zero                              \t   >+              Add 1 to Cell #2                                       \t   >+              Add 1 to Cell #3                                       \t   >-              Subtract 1 from Cell #4                                \t   >>+             Add 1 to Cell #6                                       \t   [<]             Move back to the first zero cell you find; this will   \t                   be Cell #1 which was cleared by the previous loop      \t   <-              Decrement the loop Counter in Cell #0                  \t]                  Loop till Cell #0 is zero                             \t                                                                          \tThe result of this is:                                                    \tCell No :   0   1   2   3   4   5   6                                     \tContents:   0   0  72 104  88  32   8                                     \tPointer :   ^                                                             \t                                                                          \t>>.                     Cell #2 has value 72 which is \'H\'                 \t>---.                   Subtract 3 from Cell #3 to get 101 which is \'e\'   \t+++++ ++..+++.          Likewise for \'llo\' from Cell #3                   \t>>.                     ..." /* TRUNCATED STRING LITERAL */
             ,"");
  local_1e0 = (undefined1  [8])&PTR_idle_00130880;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl._0_8_ = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0._M_impl.super__Rb_tree_header._M_header;
  local_1a0._M_impl._0_8_ = 0;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170 = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a8._M_node = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e8 = std::chrono::_V2::steady_clock::now();
  iVar4 = 5;
  do {
    uVar1 = local_170;
    local_25c = local_170;
    local_248 = local_238;
    local_170 = local_170 + 1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_280,local_278 + (long)local_280);
    local_148.super_MicrothreadBase.thread_id = uVar1;
    local_148.super_MicrothreadBase._vptr_MicrothreadBase = (_func_int **)&PTR_isResolved_001308b0;
    local_148.super_MicrothreadBase._12_1_ = 0;
    local_148.impl.
    super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_148.impl.
    super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148.cycles = 10;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_148.mailbox.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map
              ((_Deque_base<char,_std::allocator<char>_> *)&local_148.mailbox,0);
    local_148.sleep_until.__d.__r = (duration)-0x8000000000000000;
    local_148.sleeping = false;
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_248,local_240 + (long)local_248);
    pBVar2 = (BFEnvironment *)operator_new(0x60);
    local_1f8.
    super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_1f8.
    super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BFEnvironment::BFEnvironment(pBVar2,&local_1f8,0x8000);
    local_258 = pBVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<implementations::brainfck::BFEnvironment*>(&local_250,pBVar2);
    if (local_1f8.
        super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.
                 super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pBVar2 = local_258;
    local_c0 = local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_228,local_220 + (long)local_228);
    BFEnvironment::assignCode<std::__cxx11::string>
              (pBVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0
              );
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
    this_00 = (BFImplementation *)operator_new(0x38);
    local_208.
    super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_258;
    local_208.
    super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_250._M_pi;
    if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_250._M_pi)->_M_use_count = (local_250._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_250._M_pi)->_M_use_count = (local_250._M_pi)->_M_use_count + 1;
      }
    }
    BFImplementation::BFImplementation(this_00,&local_208);
    local_168 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<implementations::brainfck::BFImplementation*>(&_Stack_160,this_00);
    if (local_208.
        super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.
                 super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar5 = (undefined4)local_168;
    uVar6 = local_168._4_4_;
    uVar7 = _Stack_160._M_pi._0_4_;
    uVar8 = _Stack_160._M_pi._4_4_;
    if (local_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_158 = (undefined4)local_168;
      uStack_154 = local_168._4_4_;
      uStack_150 = _Stack_160._M_pi._0_4_;
      uStack_14c = _Stack_160._M_pi._4_4_;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250._M_pi);
      uVar5 = local_158;
      uVar6 = uStack_154;
      uVar7 = uStack_150;
      uVar8 = uStack_14c;
    }
    this._M_pi = local_148.impl.
                 super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    local_148.impl.
    super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)CONCAT44(uVar6,uVar5);
    local_148.impl.
    super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = uVar8;
    local_148.impl.
    super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = uVar7;
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    std::
    pair<unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>
    ::
    pair<unsigned_int_&,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_&,_true>
              ((pair<unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>
                *)&local_c0,&local_25c,&local_148);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>,std::_Select1st<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>
    ::
    _M_emplace_unique<std::pair<unsigned_int,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>,std::_Select1st<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>
                *)&local_1d8,
               (pair<unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>
                *)&local_c0);
    local_b8 = &PTR_isResolved_001308b0;
    std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_90);
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
    }
    local_148.super_MicrothreadBase._vptr_MicrothreadBase = (_func_int **)&PTR_isResolved_001308b0;
    std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
              ((_Deque_base<char,_std::allocator<char>_> *)&local_148.mailbox);
    if (local_148.impl.
        super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.impl.
                 super___shared_ptr<implementations::brainfck::BFImplementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Setup completed in ",0x13);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::chrono::_V2::steady_clock::now();
  do {
    iVar4 = stackless::microthreading::
            MicrothreadManager<implementations::brainfck::BFImplementation>::executeThreads
                      ((MicrothreadManager<implementations::brainfck::BFImplementation> *)local_1e0)
    ;
  } while (0 < iVar4);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run completed in ",0x11)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_1e0 = (undefined1  [8])&PTR_idle_00130880;
  std::
  _Rb_tree<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation,_stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation,_std::_Identity<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>,_std::less<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>,_std::allocator<stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::SchedulingInformation>_>
  ::~_Rb_tree(&local_1a0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>,_std::_Select1st<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>
  ::~_Rb_tree(&local_1d8);
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  return;
}

Assistant:

static void dispatch(BFFrame &frame, BFArgs &args) {
		if (frame.env->tape[frame.env->mp] != 0) {
			unsigned nesting = 1;
			--frame.env->ip;
			while (nesting > 0) {
				const BFCell &ch = frame.env->code[--frame.env->ip];
				if (ch == CellEndWhile) ++nesting;
				else if (ch == CellWhile) --nesting;
			}
		}
		if(verbose) std::cerr << "] success, *mp=" << frame.env->mp << "\n";
	}